

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMConnection
CMConnection_create(transport_entry_conflict trans,void *transport_data,attr_list conn_attrs)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  FFSBuffer p_Var4;
  AttrBuffer pAVar5;
  pthread_t pVar6;
  attr_list in_RDX;
  void *in_RSI;
  transport_entry_conflict in_RDI;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  char *value;
  CMConnection conn;
  int blocking_on_conn;
  CMConnection in_stack_ffffffffffffff68;
  CManager_conflict in_stack_ffffffffffffff70;
  FILE *pFVar7;
  undefined8 in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  FILE *in_stack_ffffffffffffff90;
  CManager in_stack_ffffffffffffff98;
  __time_t local_60;
  undefined4 local_58;
  CMTraceType in_stack_ffffffffffffffac;
  CManager in_stack_ffffffffffffffb0;
  long local_48;
  timespec local_40;
  char *local_30;
  CMConnection local_28;
  int local_1c;
  attr_list local_18;
  void *local_10;
  transport_entry_conflict local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = (CMConnection)INT_CMmalloc((size_t)in_stack_ffffffffffffff70);
  if (CMConnection_create::first != 0) {
    local_30 = getenv("CMNonBlockWrite");
    CMConnection_create::first = 0;
    if (local_30 != (char *)0x0) {
      __isoc99_sscanf(local_30,"%d",&CMConnection_create::non_block_default);
      iVar1 = CMtrace_val[2];
      if (local_8->cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          in_stack_ffffffffffffff90 = (FILE *)local_8->cm->CMTrace_file;
          _Var3 = getpid();
          in_stack_ffffffffffffff98 = (CManager)(long)_Var3;
          pVar6 = pthread_self();
          fprintf(in_stack_ffffffffffffff90,"P%lxT%lx - ",in_stack_ffffffffffffff98,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)local_8->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec
                 );
        }
        fprintf((FILE *)local_8->cm->CMTrace_file,"CM default blocking %d\n",
                (ulong)(uint)CMConnection_create::non_block_default);
      }
      fflush((FILE *)local_8->cm->CMTrace_file);
    }
    local_30 = getenv("CMReadThread");
    if (local_30 != (char *)0x0) {
      __isoc99_sscanf(local_30,"%d",&CMConnection_create::read_thread_default);
      iVar1 = CMtrace_val[2];
      if (local_8->cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)local_8->cm->CMTrace_file;
          _Var3 = getpid();
          in_stack_ffffffffffffff88 = (char *)(long)_Var3;
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",in_stack_ffffffffffffff88,pVar6);
          iVar2 = (int)((ulong)pFVar7 >> 0x20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&stack0xffffffffffffffb0);
          fprintf((FILE *)local_8->cm->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffffb0,
                  local_48);
        }
        fprintf((FILE *)local_8->cm->CMTrace_file,"CM default read thread %d\n",
                (ulong)(uint)CMConnection_create::read_thread_default);
      }
      fflush((FILE *)local_8->cm->CMTrace_file);
    }
  }
  local_28->cm = local_8->cm;
  local_28->trans = local_8;
  local_28->transport_data = local_10;
  local_28->conn_ref_count = 1;
  local_28->closed = 0;
  local_28->failed = 0;
  local_28->preloaded_formats = (FMFormat *)0x0;
  local_28->remote_format_server_ID = 0;
  local_28->remote_CManager_ID = 0;
  local_28->handshake_condition = -1;
  p_Var4 = (FFSBuffer)create_FFSBuffer();
  local_28->io_out_buffer = p_Var4;
  local_28->close_list = (CMCloseHandlerList)0x0;
  local_28->write_callback_len = 0;
  local_28->write_callbacks = (CMConnHandlerList)0x0;
  if (local_18 != (attr_list)0x0) {
    CMint_add_ref_attr_list
              (in_stack_ffffffffffffff98,(attr_list)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,iVar2);
  }
  local_28->attrs = local_18;
  pAVar5 = (AttrBuffer)create_AttrBuffer();
  local_28->attr_encode_buffer = pAVar5;
  local_28->message_buffer = (CMbuffer)0x0;
  local_28->buffer_full_point = 0;
  local_28->buffer_data_end = 0;
  local_28->characteristics = (attr_list)0x0;
  local_28->write_pending = 0;
  local_28->do_non_blocking_write = CMConnection_create::non_block_default;
  local_28->XML_output = 0;
  local_28->use_read_thread = CMConnection_create::read_thread_default;
  iVar2 = get_int_attr(local_18,CM_CONN_BLOCKING,&local_1c);
  if (iVar2 != 0) {
    local_28->do_non_blocking_write = (uint)((local_1c != 0 ^ 0xffU) & 1);
  }
  add_conn_to_CM(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  iVar2 = CMtrace_val[7];
  if (local_8->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)local_8->cm->CMTrace_file;
      _Var3 = getpid();
      pVar6 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var3,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_60);
      fprintf((FILE *)local_8->cm->CMTrace_file,"%lld.%.9ld - ",local_60,
              CONCAT44(in_stack_ffffffffffffffac,local_58));
    }
    fprintf((FILE *)local_8->cm->CMTrace_file,"CMConnection_create %p \n",local_28);
  }
  fflush((FILE *)local_8->cm->CMTrace_file);
  return local_28;
}

Assistant:

CMConnection
 CMConnection_create(transport_entry trans, void *transport_data, 
		     attr_list conn_attrs)
 {
     static int first = 1;
     static int non_block_default = 0;
     static int read_thread_default = 0;
     int blocking_on_conn;
     CMConnection conn = INT_CMmalloc(sizeof(struct _CMConnection));
     if (first) {
	 char *value = getenv("CMNonBlockWrite");
	 first = 0;
	 if (value != NULL) {
	     sscanf(value, "%d", &non_block_default);
	     CMtrace_out(trans->cm, CMConnectionVerbose, "CM default blocking %d\n",
			 non_block_default);
	 }
	 value = getenv("CMReadThread");
	 if (value != NULL) {
	     sscanf(value, "%d", &read_thread_default);
	     CMtrace_out(trans->cm, CMConnectionVerbose, "CM default read thread %d\n",
			 read_thread_default);
	 }
     }
     conn->cm = trans->cm;
     conn->trans = trans;
     conn->transport_data = transport_data;
     conn->conn_ref_count = 1;
     conn->closed = 0;
     conn->failed = 0;
     conn->preloaded_formats = NULL;
     conn->remote_format_server_ID = 0;
     conn->remote_CManager_ID = 0;
     conn->handshake_condition = -1;
     conn->io_out_buffer = create_FFSBuffer();
     conn->close_list = NULL;
     conn->write_callback_len = 0;
     conn->write_callbacks = NULL;
     if (conn_attrs) {
	 CMadd_ref_attr_list(conn->cm, conn_attrs);
     }
     conn->attrs = conn_attrs;
     conn->attr_encode_buffer = create_AttrBuffer();

     conn->message_buffer = NULL;
     conn->buffer_full_point = 0;
     conn->buffer_data_end = 0;

     conn->characteristics = NULL;
     conn->write_pending = 0;
     conn->do_non_blocking_write = non_block_default;
     conn->XML_output = 0;
     conn->use_read_thread = read_thread_default; 

     if (get_int_attr(conn_attrs, CM_CONN_BLOCKING, &blocking_on_conn)) {
	 conn->do_non_blocking_write = !blocking_on_conn;
     }
     add_conn_to_CM(trans->cm, conn);
     CMtrace_out(trans->cm, CMFreeVerbose, "CMConnection_create %p \n",
		 conn);
     return conn;
 }